

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirDEFINE(void)

{
  char cVar1;
  bool bVar2;
  char *name;
  size_t sVar3;
  char *local_20;
  char *rtrim;
  char *id;
  bool replaceEnabled;
  
  cVar1 = *lp;
  if (cVar1 == '+') {
    lp = lp + 1;
  }
  name = GetID(&lp);
  if (name == (char *)0x0) {
    Error("[DEFINE] Illegal <id>",lp,SUPPRESS);
  }
  else {
    bVar2 = White(*lp);
    if (bVar2) {
      lp = lp + 1;
    }
    local_20 = lp;
    if (eolComment != (char *)0x0) {
      sVar3 = strlen(lp);
      local_20 = local_20 + sVar3;
      while( true ) {
        bVar2 = false;
        if (lp < local_20) {
          bVar2 = local_20[-1] == ' ';
        }
        if (!bVar2) break;
        local_20 = local_20 + -1;
      }
      *local_20 = '\0';
    }
    if (cVar1 != '+') {
      CDefineTable::Add(&DefineTable,name,lp,(CStringsList *)0x0);
    }
    else {
      CDefineTable::Replace(&DefineTable,name,lp);
    }
    SkipToEol(&lp);
    substitutedLine = line;
  }
  return;
}

Assistant:

static void dirDEFINE() {
	bool replaceEnabled = ('+' == *lp) ? ++lp, true : false;
	char* id = GetID(lp);
	if (nullptr == id) {
		Error("[DEFINE] Illegal <id>", lp, SUPPRESS);
		return;
	}
	if (White(*lp)) ++lp;		// skip one whitespace (not considered part of value) (others are)
	// but trim trailing spaces of value, if there's eol-comment
	if (eolComment) {
		char *rtrim = lp + strlen(lp);
		while (lp < rtrim && ' ' == rtrim[-1]) --rtrim;
		*rtrim = 0;
	}

	if (replaceEnabled) {
		DefineTable.Replace(id, lp);
	} else {
		DefineTable.Add(id, lp, nullptr);
	}
	SkipToEol(lp);
	substitutedLine = line;		// override substituted listing for DEFINE
}